

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolutionDebug.cpp
# Opt level: O0

HighsDebugStatus debugHighsLpSolution(string *message,HighsLpSolverObject *solver_object)

{
  HighsDebugStatus HVar1;
  long in_RSI;
  HighsHessian *in_RDI;
  HighsHessian hessian;
  bool check_model_status_and_highs_info;
  bool in_stack_000001df;
  HighsBasis *in_stack_000001e0;
  HighsSolution *in_stack_000001e8;
  HighsHessian *in_stack_000001f0;
  HighsLp *in_stack_000001f8;
  HighsOptions *in_stack_00000200;
  string *in_stack_00000208;
  HighsModelStatus in_stack_00000220;
  HighsInfo *in_stack_00000228;
  HighsHessian *this;
  string local_88 [119];
  undefined1 local_11;
  long local_10;
  
  local_11 = 1;
  local_10 = in_RSI;
  HighsHessian::HighsHessian(in_RDI);
  std::__cxx11::string::string(local_88,(string *)in_RDI);
  this = *(HighsHessian **)(local_10 + 0x18);
  HVar1 = debugHighsSolution(in_stack_00000208,in_stack_00000200,in_stack_000001f8,in_stack_000001f0
                             ,in_stack_000001e8,in_stack_000001e0,in_stack_00000220,
                             in_stack_00000228,in_stack_000001df);
  std::__cxx11::string::~string(local_88);
  HighsHessian::~HighsHessian(this);
  return HVar1;
}

Assistant:

HighsDebugStatus debugHighsLpSolution(
    const std::string message, const HighsLpSolverObject& solver_object) {
  // Non-trivially expensive analysis of a solution to a model
  //
  // Called to check the unscaled model status and solution params
  const bool check_model_status_and_highs_info = true;
  // Define an empty Hessian
  HighsHessian hessian;
  return debugHighsSolution(message, solver_object.options_, solver_object.lp_,
                            hessian, solver_object.solution_,
                            solver_object.basis_, solver_object.model_status_,
                            solver_object.highs_info_,
                            check_model_status_and_highs_info);
}